

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_>::call
          (unary<tcu::Matrix<double,_3,_3>,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  int row_2;
  undefined8 *puVar7;
  GLdouble *data;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  uint uVar12;
  Matrix<double,_3,_3> arg;
  Matrix<double,_3,_3> result;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8 [8];
  undefined8 local_a8 [10];
  undefined1 local_58 [72];
  
  puVar7 = &local_f8;
  puVar6 = local_a8;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[8] = 0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar12 = 0x3ff00000;
      if (lVar8 != lVar10) {
        uVar12 = 0;
      }
      *(ulong *)((long)puVar6 + lVar10) = (ulong)uVar12 << 0x20;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
    lVar9 = lVar9 + 1;
    puVar6 = puVar6 + 1;
    lVar8 = lVar8 + 0x18;
  } while (lVar9 != 3);
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8[6] = 0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar12 = 0x3ff00000;
      if (lVar8 != lVar10) {
        uVar12 = 0;
      }
      *(ulong *)((long)puVar7 + lVar10) = (ulong)uVar12 << 0x20;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
    lVar9 = lVar9 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 8);
    lVar8 = lVar8 + 0x18;
  } while (lVar9 != 3);
  lVar8 = 0;
  do {
    *(undefined8 *)((long)local_e8 + lVar8) = *(undefined8 *)((long)argument_src + lVar8 + 0x10);
    puVar1 = (undefined4 *)((long)argument_src + lVar8);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    *(undefined4 *)((long)&local_f8 + lVar8) = *puVar1;
    *(undefined4 *)((long)&local_f8 + lVar8 + 4) = uVar2;
    *(undefined4 *)((long)&uStack_f0 + lVar8) = uVar3;
    *(undefined4 *)((long)&uStack_f0 + lVar8 + 4) = uVar4;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  puVar11 = local_58;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar11,&local_f8);
  puVar6 = local_a8;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar9) = *(undefined8 *)(puVar11 + lVar9);
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
    lVar8 = lVar8 + 1;
    puVar6 = puVar6 + 1;
    puVar11 = puVar11 + 8;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    *(undefined8 *)((long)result_dst + lVar8 + 0x10) =
         *(undefined8 *)((long)local_a8 + lVar8 + 0x10);
    uVar5 = *(undefined8 *)((long)local_a8 + lVar8 + 8);
    *(undefined8 *)((long)result_dst + lVar8) = *(undefined8 *)((long)local_a8 + lVar8);
    ((undefined8 *)((long)result_dst + lVar8))[1] = uVar5;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}